

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall QTextEdit::setAlignment(QTextEdit *this,Alignment a)

{
  long lVar1;
  ulong uVar2;
  undefined1 *puVar3;
  bool selectionClipboard;
  QTextEditPrivate *this_00;
  undefined4 in_ESI;
  long in_FS_OFFSET;
  QTextEditPrivate *d;
  QTextCursor cursor;
  QTextBlockFormat fmt;
  QTextBlockFormat *this_01;
  QTextBlockFormat local_28 [7];
  undefined4 uVar4;
  QWidgetTextControl *this_02;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTextEdit *)0x6d1a39);
  this_02 = (QWidgetTextControl *)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = (QTextBlockFormat *)&stack0xffffffffffffffe8;
  QTextBlockFormat::QTextBlockFormat(this_01);
  uVar4 = in_ESI;
  QTextBlockFormat::setAlignment
            (this_01,(QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)this_00 >> 0x20,0));
  _local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetTextControl::textCursor((QWidgetTextControl *)this_00);
  QTextCursor::mergeBlockFormat(local_28);
  puVar3 = _local_28;
  uVar2 = (ulong)_local_28 >> 0x38;
  selectionClipboard = SUB81(uVar2,0);
  _local_28 = puVar3;
  QWidgetTextControl::setTextCursor
            (this_02,(QTextCursor *)CONCAT44(uVar4,in_ESI),selectionClipboard);
  QTextEditPrivate::relayoutDocument(d);
  QTextCursor::~QTextCursor((QTextCursor *)local_28);
  QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x6d1ada);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::setAlignment(Qt::Alignment a)
{
    Q_D(QTextEdit);
    QTextBlockFormat fmt;
    fmt.setAlignment(a);
    QTextCursor cursor = d->control->textCursor();
    cursor.mergeBlockFormat(fmt);
    d->control->setTextCursor(cursor);
    d->relayoutDocument();
}